

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::isAdjoint(Graph *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  int local_2c;
  int local_28;
  int l;
  int k;
  int j;
  int i;
  int common_els;
  int size;
  int nv;
  Graph *this_local;
  
  if ((this->multigraph_status & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"Graph is multigraph! Can\'t be adjoint!");
    exit(1);
  }
  iVar1 = this->num_of_vert;
  i = 0;
  k = 0;
  do {
    if (iVar1 <= k) {
      return;
    }
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(this->adj_list + k);
    if (!bVar3) {
      for (l = 0; l < iVar1; l = l + 1) {
        if (k != l) {
          j = 0;
          bVar3 = std::vector<int,_std::allocator<int>_>::empty(this->adj_list + k);
          if ((!bVar3) ||
             (bVar3 = std::vector<int,_std::allocator<int>_>::empty(this->adj_list + l), !bVar3)) {
            for (local_28 = 0;
                sVar4 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + k),
                local_28 < (int)sVar4; local_28 = local_28 + 1) {
              for (local_2c = 0;
                  sVar4 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + l),
                  local_2c < (int)sVar4; local_2c = local_2c + 1) {
                sVar4 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + k);
                sVar5 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + l);
                if (sVar4 < sVar5) {
                  sVar4 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + l);
                  i = (int)sVar4;
                }
                else {
                  sVar4 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + k);
                  i = (int)sVar4;
                }
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (this->adj_list + k,(long)local_28);
                iVar2 = *pvVar6;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (this->adj_list + l,(long)local_2c);
                if (iVar2 == *pvVar6) {
                  j = j + 1;
                }
              }
            }
            if ((j != i) && (j != 0)) {
              this->adjoint_status = false;
              return;
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void Graph::isAdjoint(){
   if(this->multigraph_status){
      cerr << "Graph is multigraph! Can't be adjoint!";
      exit(EXIT_FAILURE);
   }
   int nv = this->num_of_vert, size = 0, common_els = 0;
   for(int i = 0; i < nv; i++){
      // checks if there is any vertex that has any successors
      if(not(this->adj_list[i].empty()))
         for(int j = 0; j < nv; j++){
            if (i == j)
               continue;
            common_els = 0;
            if(this->adj_list[i].empty() and this->adj_list[j].empty())
               continue;
            for(int k = 0; k < (int)this->adj_list[i].size(); k++){
               for(int l = 0; l < (int)this->adj_list[j].size(); l++){
                  // sets the number of our common elements
                  if(this->adj_list[i].size() >= this->adj_list[j].size())
                     size = (int)this->adj_list[i].size();
                  else
                     size = (int)this->adj_list[j].size();
                  // if we found common element, then we increment
                  if(this->adj_list[i][k] == this->adj_list[j][l])
                     common_els++;
               }
            }
            // graph not adjoint; common elements for two vertices are not equal and this is not empty set
            if((common_els not_eq size) and
               (common_els not_eq 0)){
               this->adjoint_status = false;
               return void();
            }
         }
   }
   return void();
}